

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determineIncludes.cpp
# Opt level: O0

void determineIncludes(Module *module,Program *program)

{
  bool bVar1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  func_00;
  long in_RSI;
  string trimmed;
  string name;
  Function *func;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  undefined2 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  string *in_stack_ffffffffffffff58;
  PassType pass;
  Program *in_stack_ffffffffffffff60;
  string local_90 [24];
  StringRef *in_stack_ffffffffffffff88;
  string local_60 [32];
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  local_28;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_28 = llvm::Module::functions((Module *)in_stack_ffffffffffffff60);
  local_18 = &local_28;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(local_18);
  func_00 = llvm::
            iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
            ::end(local_18);
  while( true ) {
    pass = (PassType)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    bVar1 = llvm::operator!=(&local_30,
                             (ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                              *)&stack0xffffffffffffffc8);
    if (!bVar1) break;
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x28b2a9);
    llvm::Value::getName();
    in_stack_ffffffffffffff58 = local_60;
    llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff88);
    trimPrefix((string *)func_00.NodePtr);
    in_stack_ffffffffffffff57 =
         isCFunc((string *)
                 CONCAT17(in_stack_ffffffffffffff57,
                          CONCAT16(in_stack_ffffffffffffff56,
                                   CONCAT15(in_stack_ffffffffffffff55,
                                            CONCAT14(in_stack_ffffffffffffff54,
                                                     CONCAT13(in_stack_ffffffffffffff53,
                                                              CONCAT12(in_stack_ffffffffffffff52,
                                                                       in_stack_ffffffffffffff50))))
                                  )));
    if ((bool)in_stack_ffffffffffffff57) {
      std::__cxx11::string::operator=(local_60,local_90);
    }
    in_stack_ffffffffffffff56 =
         isStdLibFunc((string *)
                      CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,
                                        CONCAT15(in_stack_ffffffffffffff55,
                                                 CONCAT14(in_stack_ffffffffffffff54,
                                                          CONCAT13(in_stack_ffffffffffffff53,
                                                                   CONCAT12(
                                                  in_stack_ffffffffffffff52,
                                                  in_stack_ffffffffffffff50)))))));
    if ((bool)in_stack_ffffffffffffff56) {
      *(undefined1 *)(local_10 + 0x256) = 1;
    }
    in_stack_ffffffffffffff55 =
         isStringFunc((string *)
                      CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,
                                        CONCAT15(in_stack_ffffffffffffff55,
                                                 CONCAT14(in_stack_ffffffffffffff54,
                                                          CONCAT13(in_stack_ffffffffffffff53,
                                                                   CONCAT12(
                                                  in_stack_ffffffffffffff52,
                                                  in_stack_ffffffffffffff50)))))));
    if ((bool)in_stack_ffffffffffffff55) {
      *(undefined1 *)(local_10 + 599) = 1;
    }
    in_stack_ffffffffffffff54 =
         isStdioFunc((string *)
                     CONCAT17(in_stack_ffffffffffffff57,
                              CONCAT16(in_stack_ffffffffffffff56,
                                       CONCAT15(in_stack_ffffffffffffff55,
                                                CONCAT14(in_stack_ffffffffffffff54,
                                                         CONCAT13(in_stack_ffffffffffffff53,
                                                                  CONCAT12(in_stack_ffffffffffffff52
                                                                           ,
                                                  in_stack_ffffffffffffff50)))))));
    if ((bool)in_stack_ffffffffffffff54) {
      *(undefined1 *)(local_10 + 600) = 1;
    }
    in_stack_ffffffffffffff53 =
         isPthreadFunc((string *)
                       CONCAT17(in_stack_ffffffffffffff57,
                                CONCAT16(in_stack_ffffffffffffff56,
                                         CONCAT15(in_stack_ffffffffffffff55,
                                                  CONCAT14(in_stack_ffffffffffffff54,
                                                           CONCAT13(in_stack_ffffffffffffff53,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff52,
                                                  in_stack_ffffffffffffff50)))))));
    if ((bool)in_stack_ffffffffffffff53) {
      *(undefined1 *)(local_10 + 0x259) = 1;
    }
    in_stack_ffffffffffffff52 =
         isCMath((string *)
                 CONCAT17(in_stack_ffffffffffffff57,
                          CONCAT16(in_stack_ffffffffffffff56,
                                   CONCAT15(in_stack_ffffffffffffff55,
                                            CONCAT14(in_stack_ffffffffffffff54,
                                                     CONCAT13(in_stack_ffffffffffffff53,
                                                              CONCAT12(in_stack_ffffffffffffff52,
                                                                       in_stack_ffffffffffffff50))))
                                  )));
    if ((bool)in_stack_ffffffffffffff52) {
      *(undefined1 *)(local_10 + 0x25a) = 1;
    }
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_60);
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)CONCAT17(in_stack_ffffffffffffff57,
                             CONCAT16(in_stack_ffffffffffffff56,
                                      CONCAT15(in_stack_ffffffffffffff55,
                                               CONCAT14(in_stack_ffffffffffffff54,
                                                        CONCAT13(in_stack_ffffffffffffff53,
                                                                 CONCAT12(in_stack_ffffffffffffff52,
                                                                          in_stack_ffffffffffffff50)
                                                                ))))));
  }
  Program::addPass(in_stack_ffffffffffffff60,pass);
  return;
}

Assistant:

void determineIncludes(const llvm::Module* module, Program& program) {
    for (const llvm::Function& func : module->functions()) {
        std::string name = func.getName().str();
        std::string trimmed = trimPrefix(name);

        if (isCFunc(trimmed)) {
            name = trimmed;
        }

        if (isStdLibFunc(name)) {
            program.hasStdLib = true;
        }

        if (isStringFunc(name)) {
            program.hasString = true;
        }

        if (isStdioFunc(name)) {
            program.hasStdio = true;
        }

        if (isPthreadFunc(name)) {
            program.hasPthread = true;
        }

        if (isCMath(name)) {
            program.hasCMath = true;
        }

    }

    program.addPass(PassType::DetermineIncludes);
}